

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_modMult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,uECC_word_t *mod,
                     wordcount_t num_words)

{
  uECC_word_t *puVar1;
  uECC_word_t *puVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  short sVar16;
  int iVar17;
  long lVar18;
  uECC_word_t mod_multiple [8];
  uECC_word_t product [8];
  uECC_word_t tmp [8];
  ulong auStack_4f8 [122];
  uECC_word_t *local_128 [4];
  ulong *local_108;
  ulong *local_100;
  ulong local_f8 [8];
  uECC_word_t local_b8 [8];
  uECC_word_t local_78 [9];
  
  iVar12 = (int)CONCAT71(in_register_00000081,num_words);
  local_128[3] = result;
  uECC_vli_mult(local_b8,left,right,num_words);
  local_128[0] = local_78;
  local_128[1] = local_b8;
  uVar5 = uECC_vli_numBits(mod,num_words);
  iVar17 = iVar12 * 0x80 - (uint)uVar5;
  sVar16 = (short)iVar17;
  iVar10 = (int)sVar16;
  iVar6 = iVar10 + 0x3f;
  if (-1 < sVar16) {
    iVar6 = iVar10;
  }
  cVar8 = (char)(iVar6 >> 6);
  if ('\0' < cVar8) {
    memset(local_f8,0,(ulong)((iVar6 >> 6 & 0x7fU) << 3));
  }
  lVar18 = (long)num_words;
  if (iVar10 % 0x40 < 1) {
    if ('\0' < num_words) {
      memcpy(local_f8 + cVar8,mod,(ulong)(byte)num_words << 3);
    }
  }
  else if (num_words != '\0') {
    bVar4 = (byte)(iVar10 % 0x40);
    lVar11 = 0;
    uVar13 = 0;
    do {
      uVar14 = mod[lVar11] << (bVar4 & 0x3f) | uVar13;
      uVar13 = mod[lVar11] >> (0x40 - bVar4 & 0x3f);
      local_f8[cVar8 + lVar11] = uVar14;
      lVar11 = lVar11 + 1;
    } while (lVar18 != lVar11);
  }
  if (sVar16 < 0) {
    uVar13 = 1;
  }
  else {
    local_100 = local_f8 + (byte)num_words;
    local_108 = local_f8 + lVar18 + (byte)num_words;
    uVar13 = 1;
    do {
      if (num_words < '\x01') {
        uVar14 = 0;
      }
      else {
        puVar1 = local_128[uVar13];
        puVar2 = local_128[uVar13 ^ 1];
        iVar6 = 1;
        uVar14 = 0;
        do {
          cVar8 = (char)iVar6;
          cVar9 = cVar8 + -1;
          uVar7 = local_f8[cVar9] + uVar14;
          if (uVar7 != 0) {
            uVar14 = (ulong)(puVar1[cVar9] < uVar7);
          }
          puVar2[cVar9] = puVar1[cVar9] - uVar7;
          iVar6 = cVar8 + 1;
        } while ((int)cVar8 < iVar12 * 2);
      }
      if (num_words < '\x01') {
        local_f8[iVar12 + -1] = local_f8[iVar12 + -1] | local_f8[lVar18] << 0x3f;
      }
      else {
        uVar7 = 0;
        puVar15 = local_100;
        do {
          uVar3 = puVar15[-1];
          puVar15[-1] = uVar3 >> 1 | uVar7;
          puVar15 = puVar15 + -1;
          uVar7 = uVar3 << 0x3f;
        } while (local_f8 < puVar15);
        local_f8[iVar12 + -1] = local_f8[iVar12 + -1] | local_f8[lVar18] << 0x3f;
        if ('\0' < num_words) {
          uVar7 = 0;
          puVar15 = local_108;
          do {
            uVar3 = puVar15[-1];
            puVar15[-1] = uVar3 >> 1 | uVar7;
            puVar15 = puVar15 + -1;
            uVar7 = uVar3 << 0x3f;
          } while (local_f8 + lVar18 < puVar15);
        }
      }
      uVar13 = (ulong)(uVar13 == uVar14);
      sVar16 = (short)iVar17;
      iVar17 = iVar17 + -1;
    } while (0 < sVar16);
  }
  if ('\0' < num_words) {
    puVar1 = local_128[uVar13];
    uVar13 = 0;
    do {
      local_128[3][uVar13] = puVar1[uVar13];
      uVar13 = uVar13 + 1;
    } while ((byte)num_words != uVar13);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_modMult(uECC_word_t *result,
                                   const uECC_word_t *left,
                                   const uECC_word_t *right,
                                   const uECC_word_t *mod,
                                   wordcount_t num_words) {
    uECC_word_t product[2 * uECC_MAX_WORDS];
    uECC_vli_mult(product, left, right, num_words);
    uECC_vli_mmod(result, product, mod, num_words);
}